

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingState<unsigned_char,_signed_char>::CalculateDeltaStats
          (BitpackingState<unsigned_char,_signed_char> *this)

{
  uchar *puVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  char right;
  long lVar5;
  char left;
  
  if ((char)this->maximum < '\0') {
    return;
  }
  uVar4 = this->compression_buffer_idx;
  if (uVar4 < 2) {
    return;
  }
  if (this->all_valid != true) {
    return;
  }
  if ((long)uVar4 < 1) {
    this->can_do_delta = true;
  }
  else {
    puVar1 = this->compression_buffer;
    lVar5 = 0;
    do {
      this->delta_buffer[lVar5] = puVar1[lVar5] - puVar1[lVar5 + -1];
      lVar5 = lVar5 + 1;
      uVar4 = this->compression_buffer_idx;
    } while (lVar5 < (long)uVar4);
    this->can_do_delta = true;
    if (uVar4 < 2) {
      right = this->minimum_delta;
      left = this->maximum_delta;
      goto LAB_01725a7f;
    }
  }
  right = this->minimum_delta;
  left = this->maximum_delta;
  lVar5 = 0;
  do {
    cVar2 = this->delta_buffer[lVar5 + 1];
    if (this->delta_buffer[lVar5 + 1] < left) {
      cVar2 = left;
    }
    left = cVar2;
    this->maximum_delta = left;
    cVar2 = this->delta_buffer[lVar5 + 1];
    if (right < this->delta_buffer[lVar5 + 1]) {
      cVar2 = right;
    }
    right = cVar2;
    this->minimum_delta = right;
    lVar5 = lVar5 + 1;
  } while (uVar4 - 1 != lVar5);
LAB_01725a7f:
  this->delta_buffer[0] = right;
  bVar3 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                    (left,right,&this->min_max_delta_diff);
  this->can_do_delta = bVar3;
  if (bVar3) {
    bVar3 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                      (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
  }
  else {
    bVar3 = false;
  }
  this->can_do_delta = bVar3;
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}